

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

char ** lys_features_list(lys_module *module,uint8_t **states)

{
  lys_feature *plVar1;
  lys_submodule *plVar2;
  char **__ptr;
  uint8_t *puVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  byte bVar10;
  
  if (module == (lys_module *)0x0) {
LAB_0015c54c:
    __ptr = (char **)0x0;
  }
  else {
    bVar10 = module->features_size;
    uVar9 = (uint)bVar10;
    for (lVar5 = 0; (ulong)module->inc_size * 0x30 - lVar5 != 0; lVar5 = lVar5 + 0x30) {
      uVar9 = uVar9 + *(byte *)(*(long *)(module->inc->rev + lVar5 + -8) + 0x4c);
    }
    __ptr = (char **)malloc((ulong)(uVar9 + 1) * 8);
    if (__ptr == (char **)0x0) {
      ly_log(module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_features_list");
      return (char **)0x0;
    }
    if (states != (uint8_t **)0x0) {
      puVar3 = (uint8_t *)malloc((ulong)(uVar9 + 1));
      *states = puVar3;
      if (puVar3 == (uint8_t *)0x0) {
        ly_log(module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_features_list");
        free(__ptr);
        goto LAB_0015c54c;
      }
    }
    lVar5 = 0;
    for (uVar4 = 0; uVar4 < bVar10; uVar4 = uVar4 + 1) {
      plVar1 = module->features;
      __ptr[uVar4] = *(char **)(plVar1->padding + lVar5 + -0x1c);
      if (states != (uint8_t **)0x0) {
        (*states)[uVar4] = plVar1->padding[lVar5 + -3] & 1;
      }
      bVar10 = module->features_size;
      lVar5 = lVar5 + 0x40;
    }
    uVar6 = 0;
    while( true ) {
      if (module->inc_size <= uVar6) break;
      lVar5 = 0;
      for (uVar7 = 0; plVar2 = module->inc[uVar6].submodule, uVar7 < plVar2->features_size;
          uVar7 = uVar7 + 1) {
        plVar1 = plVar2->features;
        uVar8 = (uVar4 & 0xffffffff) + uVar7 & 0xffffffff;
        __ptr[uVar8] = *(char **)(plVar1->padding + lVar5 + -0x1c);
        if (states != (uint8_t **)0x0) {
          (*states)[uVar8] = plVar1->padding[lVar5 + -3] & 1;
        }
        lVar5 = lVar5 + 0x40;
      }
      uVar6 = uVar6 + 1;
      uVar4 = (ulong)(uint)((int)uVar4 + (int)uVar7);
    }
    __ptr[uVar4 & 0xffffffff] = (char *)0x0;
  }
  return __ptr;
}

Assistant:

API const char **
lys_features_list(const struct lys_module *module, uint8_t **states)
{
    const char **result = NULL;
    int i, j;
    unsigned int count;

    if (!module) {
        return NULL;
    }

    count = module->features_size;
    for (i = 0; i < module->inc_size; i++) {
        count += module->inc[i].submodule->features_size;
    }
    result = malloc((count + 1) * sizeof *result);
    LY_CHECK_ERR_RETURN(!result, LOGMEM(module->ctx), NULL);

    if (states) {
        *states = malloc((count + 1) * sizeof **states);
        LY_CHECK_ERR_RETURN(!(*states), LOGMEM(module->ctx); free(result), NULL);
    }
    count = 0;

    /* module itself */
    for (i = 0; i < module->features_size; i++) {
        result[count] = module->features[i].name;
        if (states) {
            if (module->features[i].flags & LYS_FENABLED) {
                (*states)[count] = 1;
            } else {
                (*states)[count] = 0;
            }
        }
        count++;
    }

    /* submodules */
    for (j = 0; j < module->inc_size; j++) {
        for (i = 0; i < module->inc[j].submodule->features_size; i++) {
            result[count] = module->inc[j].submodule->features[i].name;
            if (states) {
                if (module->inc[j].submodule->features[i].flags & LYS_FENABLED) {
                    (*states)[count] = 1;
                } else {
                    (*states)[count] = 0;
                }
            }
            count++;
        }
    }

    /* terminating NULL byte */
    result[count] = NULL;

    return result;
}